

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slcanpty.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uint __i;
  int iVar7;
  uint __fd;
  uint __fd_00;
  int iVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  ssize_t sVar12;
  ulong uVar13;
  ulong uVar14;
  size_t sVar15;
  uint uVar16;
  can_filter *__optval;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  byte *pbVar20;
  uint uVar21;
  socklen_t __optlen;
  uint uVar22;
  ulong uVar23;
  bool bVar24;
  char replybuf [10];
  char buf [33];
  can_filter fi;
  long local_120;
  long local_118;
  sockaddr_can addr;
  fd_set rdfs;
  termios local_78;
  
  if (argc != 3) {
    pcVar10 = __xpg_basename(*argv);
    fprintf(_stderr,
            "%s: adapter for applications using the slcan ASCII protocol.\n\n%s creates a pty for applications using the slcan ASCII protocol and\nconverts the ASCII data to a CAN network interface (and vice versa)\n\nUsage: %s <pty> <can interface>\n\nExamples:\n%s /dev/ptyc0 can0  - creates /dev/ttyc0 for the slcan application\n\ne.g. for pseudo-terminal \'%s %s can0\' creates /dev/pts/N\n\n"
            ,pcVar10,pcVar10,pcVar10,pcVar10,pcVar10,"/dev/ptmx");
    return 1;
  }
  for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
    rdfs.fds_bits[lVar9] = 0;
  }
  rdfs.fds_bits[0]._0_1_ = (byte)rdfs.fds_bits[0] | 1;
  local_78.c_iflag = 0;
  local_78.c_oflag = 0;
  local_78.c_cflag = 0;
  local_78.c_lflag = 0;
  iVar7 = select(1,(fd_set *)&rdfs,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&local_78);
  bVar3 = true;
  if ((-1 < iVar7) && ((iVar7 == 0 || (iVar7 = getchar(), iVar7 != -1)))) {
    bVar3 = false;
  }
  __fd = open(argv[1],2);
  if ((int)__fd < 0) {
    pcVar10 = "open pty";
  }
  else {
    iVar7 = tcgetattr(__fd,&local_78);
    if (iVar7 == 0) {
      local_78._8_8_ = local_78._8_8_ & 0xfffff385ffffffff;
      local_78._0_8_ = local_78._0_8_ & 0xfffffffffffffebf | 0x40;
      tcsetattr(__fd,0,&local_78);
      iVar7 = strcmp(argv[1],"/dev/ptmx");
      if (iVar7 == 0) {
        iVar7 = grantpt(__fd);
        if (iVar7 < 0) {
          pcVar10 = "grantpt";
          goto LAB_00101b8f;
        }
        iVar7 = unlockpt(__fd);
        if (iVar7 < 0) {
          pcVar10 = "unlockpt";
          goto LAB_00101b8f;
        }
        pcVar10 = ptsname(__fd);
        if (pcVar10 == (char *)0x0) {
          pcVar10 = "ptsname";
          goto LAB_00101b8f;
        }
        printf("open: %s: slave pseudo-terminal is %s\n",argv[1],pcVar10);
      }
      __fd_00 = socket(0x1d,3,1);
      if ((int)__fd_00 < 0) {
        pcVar10 = "socket";
      }
      else {
        addr.can_family = 0x1d;
        addr.can_ifindex = if_nametoindex(argv[2]);
        if (addr.can_ifindex != 0) {
          setsockopt(__fd_00,0x65,1,(void *)0x0,0);
          iVar7 = bind(__fd_00,(sockaddr *)&addr,0x18);
          if (iVar7 < 0) {
            pcVar10 = "bind";
LAB_00101b6c:
            perror(pcVar10);
            return 1;
          }
          fi.can_id = 0;
          fi.can_mask = 0;
          uVar18 = 1L << ((byte)__fd & 0x3f);
          uVar11 = 1L << ((byte)__fd_00 & 0x3f);
          bVar6 = 0;
          do {
            do {
              for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
                rdfs.fds_bits[lVar9] = 0;
              }
              if (!bVar3) {
                rdfs.fds_bits[0]._0_1_ = (byte)rdfs.fds_bits[0] | 1;
              }
              rdfs.fds_bits[__fd >> 6] = rdfs.fds_bits[__fd >> 6] | uVar18;
              rdfs.fds_bits[__fd_00 >> 6] = rdfs.fds_bits[__fd_00 >> 6] | uVar11;
              iVar7 = select(__fd_00 + 1,(fd_set *)&rdfs,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0)
              ;
              if (iVar7 < 0) {
                pcVar10 = "select";
                goto LAB_00101b6c;
              }
              if (((byte)rdfs.fds_bits[0] & 1) != 0) goto LAB_00101bb4;
              uVar17 = pty2can_rxoffset;
              if ((rdfs.fds_bits[__fd >> 6] & uVar18) != 0) {
                sVar12 = read(__fd,&pty2can_buf + pty2can_rxoffset,199 - (ulong)pty2can_rxoffset);
                iVar7 = (int)sVar12;
                if (0 < iVar7) {
                  uVar13 = (ulong)(iVar7 + pty2can_rxoffset);
                  pty2can_rxoffset = 0;
LAB_001015a4:
                  uVar23 = uVar13 & 0xffffffff;
                  while( true ) {
                    bVar4 = pty2can_buf;
                    uVar21 = (uint)pty2can_buf;
                    if ((uVar21 != 0xd) || (uVar23 == 0)) break;
                    for (uVar19 = 0; uVar23 != uVar19; uVar19 = uVar19 + 1) {
                      (&pty2can_buf)[uVar19] = (&DAT_00105191)[uVar19];
                    }
                    uVar13 = (ulong)((int)uVar13 - 1);
                    uVar23 = uVar23 - 1;
                  }
                  uVar17 = pty2can_rxoffset;
                  if (uVar23 == 0) goto LAB_0010194c;
                  uVar19 = uVar13 & 0xffffffff;
                  uVar13 = 0;
                  while( true ) {
                    uVar22 = (uint)uVar23;
                    uVar17 = uVar22;
                    if (uVar19 == uVar13) goto LAB_0010194c;
                    if ((&pty2can_buf)[uVar13] == '\r') break;
                    uVar13 = uVar13 + 1;
                  }
                  if (uVar22 == (uint)uVar13) goto LAB_0010194c;
                  (&pty2can_buf)[uVar23 & 0xffffffff] = 0;
                  if ((bVar4 & 0xdf) == 0x4d) {
                    DAT_00105199 = 0;
                    iVar7 = 9;
                    goto LAB_00101625;
                  }
                  iVar7 = 1;
                  switch(uVar21) {
                  case 0x41:
                  case 0x50:
                    break;
                  case 0x42:
                  case 0x44:
                  case 0x45:
                  case 0x47:
                  case 0x48:
                  case 0x49:
                  case 0x4a:
                  case 0x4b:
                  case 0x4c:
                  case 0x4d:
                  case 0x51:
                  case 0x57:
                  case 0x59:
                    goto switchD_00101697_caseD_42;
                  case 0x43:
                    __optval = (can_filter *)0x0;
                    __optlen = 0;
                    goto LAB_00101826;
                  case 0x46:
                    builtin_strncpy(replybuf,"F00\r",5);
                    goto LAB_001018bc;
                  case 0x4e:
                    builtin_strncpy(replybuf,"N4242\r",7);
                    goto LAB_001018bc;
                  case 0x4f:
                    __optval = &fi;
                    __optlen = 8;
LAB_00101826:
                    iVar7 = 1;
                    setsockopt(__fd_00,0x65,1,__optval,__optlen);
LAB_00101625:
                    replybuf[0] = '\r';
                    goto LAB_0010162a;
                  case 0x52:
                  case 0x54:
switchD_00101697_caseD_52:
                    bVar24 = (bVar4 & 0x20) == 0;
                    iVar2 = (uint)bVar24 * 5;
                    iVar7 = iVar2 + 4;
                    uVar17 = (uint)bVar24 * 5;
                    uVar13 = (ulong)uVar17;
                    iVar8 = uVar17 + 4;
                    buf[8] = '\0';
                    buf[9] = '\0';
                    buf[10] = '\0';
                    buf[0xb] = '\0';
                    buf[0xc] = '\0';
                    buf[0xd] = '\0';
                    buf[0xe] = '\0';
                    buf[0xf] = '\0';
                    cVar1 = (&DAT_00105194)[uVar13];
                    if ((uVar21 & 0x56) == 0x52) {
                      if (cVar1 == '0') {
                        uVar17 = 0;
                        goto LAB_0010170c;
                      }
                      (&DAT_00105194)[uVar13] = 0;
                      uVar14 = strtoul((char *)&DAT_00105191,(char **)0x0,0x10);
                      buf._0_4_ = (uVar21 & 0x20) * 0x4000000 + 0xc0000000 | (uint)uVar14;
                      (&DAT_00105194)[uVar13] = cVar1;
                      buf[4] = '\0';
                      iVar7 = iVar2 + 3;
                    }
                    else {
                      uVar17 = (uint)(byte)(cVar1 - 0x30U);
                      if (8 < (byte)(cVar1 - 0x30U)) break;
LAB_0010170c:
                      (&DAT_00105194)[uVar13] = 0;
                      buf[4] = (char)uVar17;
                      uVar14 = strtoul((char *)&DAT_00105191,(char **)0x0,0x10);
                      uVar16 = (uint)uVar14 | 0x80000000;
                      if ((bVar4 & 0x20) != 0) {
                        uVar16 = (uint)uVar14;
                      }
                      buf._0_4_ = uVar16 | 0x40000000;
                      if ((uVar21 & 0x56) != 0x52) {
                        buf._0_4_ = uVar16;
                      }
                      pbVar20 = (byte *)(buf + 8);
                      for (uVar14 = 0; iVar7 = (int)uVar14, uVar17 * 2 != uVar14;
                          uVar14 = uVar14 + 2) {
                        bVar4 = asc2nibble((&DAT_00105195)[uVar14 + uVar13]);
                        if (0xf < bVar4) {
                          iVar7 = iVar8 + iVar7 + 2;
                          goto switchD_00101697_caseD_41;
                        }
                        *pbVar20 = bVar4 << 4;
                        bVar5 = asc2nibble(*(char *)(uVar13 + 0x105196 + uVar14));
                        if (0xf < bVar5) {
                          iVar7 = iVar8 + iVar7 + 3;
                          goto switchD_00101697_caseD_41;
                        }
                        *pbVar20 = bVar5 | bVar4 << 4;
                        pbVar20 = pbVar20 + 1;
                      }
                      iVar7 = iVar8 + (uint)((char)uVar17 == '\0') + iVar7;
                    }
                    sVar12 = write(__fd_00,buf,0x10);
                    if ((int)sVar12 == 0x10) goto LAB_00101625;
                    pcVar10 = "write socket";
                    goto LAB_00101baf;
                  case 0x53:
                  case 0x55:
                    goto switchD_00101697_caseD_53;
                  case 0x56:
                    builtin_strncpy(replybuf,"V1013\r",7);
LAB_001018bc:
                    sVar15 = strlen(replybuf);
                    uVar17 = (uint)sVar15;
                    iVar7 = 1;
                    goto LAB_0010162d;
                  case 0x58:
                    iVar7 = 2;
                    if ((DAT_00105191 & 1) != 0) goto LAB_00101625;
                    break;
                  case 0x5a:
                    bVar6 = DAT_00105191 & 1;
                    goto switchD_00101697_caseD_53;
                  default:
                    switch(uVar21) {
                    case 0x72:
                    case 0x74:
                      goto switchD_00101697_caseD_52;
                    case 0x73:
                      iVar7 = 5;
                      goto LAB_00101625;
                    case 0x76:
                      builtin_strncpy(replybuf,"v1014\r",7);
                      goto LAB_001018bc;
                    }
                    goto switchD_00101697_caseD_42;
                  }
                  goto switchD_00101697_caseD_41;
                }
                if (-1 < iVar7) goto LAB_00101bb4;
                pcVar10 = "read pty";
                goto LAB_00101baf;
              }
LAB_0010194c:
              pty2can_rxoffset = uVar17;
            } while ((rdfs.fds_bits[__fd_00 >> 6] & uVar11) == 0);
            sVar12 = read(__fd_00,replybuf,0x10);
            cVar1 = replybuf[4];
            if ((int)sVar12 != 0x10) {
              pcVar10 = "read socket";
              goto LAB_00101baf;
            }
            uVar17 = (uint)((replybuf[3] & 0x40U) == 0) * 2 + 0x52;
            if (replybuf[3] < '\0') {
              uVar21 = CONCAT13(replybuf[3],CONCAT21(replybuf._1_2_,replybuf[0])) & 0x1fffffff;
              pcVar10 = "%c%08X%d";
            }
            else {
              uVar17 = uVar17 | 0x20;
              uVar21 = CONCAT21(replybuf._1_2_,replybuf[0]) & 0x7ff;
              pcVar10 = "%c%03X%d";
            }
            uVar13 = (ulong)(byte)replybuf[4];
            sprintf(buf,pcVar10,(ulong)uVar17,(ulong)uVar21);
            sVar15 = strlen(buf);
            pcVar10 = buf + (int)sVar15;
            for (uVar23 = 0; uVar13 != uVar23; uVar23 = uVar23 + 1) {
              sprintf(pcVar10,"%02X",(ulong)(byte)replybuf[uVar23 + 8]);
              pcVar10 = pcVar10 + 2;
            }
            if (bVar6 != 0) {
              iVar7 = ioctl(__fd_00,0x8906,&local_120);
              if (iVar7 < 0) {
                perror("SIOCGSTAMP");
              }
              sprintf(buf + (int)((int)sVar15 + (uint)(byte)cVar1 * 2),"%04llX",
                      (local_120 % 0x3c) * 1000 + local_118 / 1000);
            }
            sVar15 = strlen(buf);
            (buf + sVar15)[0] = '\r';
            (buf + sVar15)[1] = '\0';
            sVar15 = strlen(buf);
            sVar12 = write(__fd,buf,sVar15);
            if ((int)sVar12 < 0) {
              pcVar10 = "write pty";
LAB_00101baf:
              perror(pcVar10);
LAB_00101bb4:
              close(__fd);
              close(__fd_00);
              return 0;
            }
            fflush((FILE *)0x0);
          } while( true );
        }
        pcVar10 = "if_nametoindex";
        addr.can_ifindex = 0;
      }
    }
    else {
      pcVar10 = "tcgetattr";
    }
  }
LAB_00101b8f:
  perror(pcVar10);
  return 1;
switchD_00101697_caseD_53:
  iVar7 = 2;
  goto LAB_00101625;
switchD_00101697_caseD_42:
  iVar7 = uVar22 - 1;
switchD_00101697_caseD_41:
  replybuf[0] = '\a';
LAB_0010162a:
  uVar17 = 1;
LAB_0010162d:
  sVar12 = write(__fd,replybuf,(ulong)uVar17);
  if ((int)sVar12 < 0) {
    pcVar10 = "write pty replybuf";
    goto LAB_00101baf;
  }
  uVar17 = pty2can_rxoffset;
  if (uVar22 <= iVar7 + 1U) goto LAB_0010194c;
  uVar14 = (ulong)(iVar7 + 1U);
  uVar13 = (uVar23 & 0xffffffff) - uVar14;
  for (lVar9 = 0; uVar19 - uVar14 != lVar9; lVar9 = lVar9 + 1) {
    (&pty2can_buf)[lVar9] = (&pty2can_buf)[uVar14 + lVar9];
  }
  goto LAB_001015a4;
}

Assistant:

int main(int argc, char **argv)
{
	fd_set rdfs;
	int p; /* pty master file */
	int s; /* can raw socket */
	struct sockaddr_can addr;
	struct termios topts;
	int select_stdin = 0;
	int running = 1;
	int tstamp = 0;
	int is_open = 0;
	struct can_filter fi;

	/* check command line options */
	if (argc != 3) {
		print_usage(basename(argv[0]));
		return 1;
	}

	select_stdin = check_select_stdin();

	/* open pty */
	p = open(argv[1], O_RDWR);
	if (p < 0) {
		perror("open pty");
		return 1;
	}

	if (tcgetattr(p, &topts)) {
		perror("tcgetattr");
		return 1;
	}

	/* disable local echo which would cause double frames */
	topts.c_lflag &= ~(ICANON | ECHO | ECHOE | ECHOK | ECHONL | ECHOPRT | ECHOKE);
	topts.c_iflag &= ~(ICRNL);
	topts.c_iflag |= INLCR;
	tcsetattr(p, TCSANOW, &topts);

	/* Support for the Unix 98 pseudo-terminal interface /dev/ptmx /dev/pts/N */
	if (strcmp(argv[1], DEVICE_NAME_PTMX) == 0) {
		char *name_pts = NULL; /* slave pseudo-terminal device name */

		if (grantpt(p) < 0) {
			perror("grantpt");
			return 1;
		}

		if (unlockpt(p) < 0) {
			perror("unlockpt");
			return 1;
		}

		name_pts = ptsname(p);
		if (name_pts == NULL) {
			perror("ptsname");
			return 1;
		}
		printf("open: %s: slave pseudo-terminal is %s\n", argv[1], name_pts);
	}

	/* open socket */
	s = socket(PF_CAN, SOCK_RAW, CAN_RAW);
	if (s < 0) {
		perror("socket");
		return 1;
	}

	addr.can_family = AF_CAN;
	addr.can_ifindex = if_nametoindex(argv[2]);
	if (!addr.can_ifindex) {
		perror("if_nametoindex");
		return 1;
	}

	/* disable reception of CAN frames until we are opened by 'O' */
	setsockopt(s, SOL_CAN_RAW, CAN_RAW_FILTER, NULL, 0);

	if (bind(s, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
		perror("bind");
		return 1;
	}

	/* open filter by default */
	fi.can_id = 0;
	fi.can_mask = 0;

	while (running) {
		FD_ZERO(&rdfs);

		if (select_stdin)
			FD_SET(0, &rdfs);

		FD_SET(p, &rdfs);
		FD_SET(s, &rdfs);

		if (select(s + 1, &rdfs, NULL, NULL, NULL) < 0) {
			perror("select");
			return 1;
		}

		if (FD_ISSET(0, &rdfs)) {
			running = 0;
			continue;
		}

		if (FD_ISSET(p, &rdfs))
			if (pty2can(p, s, &fi, &is_open, &tstamp)) {
				running = 0;
				continue;
			}

		if (FD_ISSET(s, &rdfs))
			if (can2pty(p, s, &tstamp)) {
				running = 0;
				continue;
			}
	}

	close(p);
	close(s);

	return 0;
}